

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void av1_set_mv_search_params(AV1_COMP *cpi)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  long *in_RDI;
  int use_auto_mv_step;
  FRAME_UPDATE_TYPE cur_update_type;
  int max_mv_def;
  MotionVectorSearchParams *mv_search_params;
  AV1_COMMON *cm;
  int local_30;
  int local_28;
  
  plVar3 = in_RDI + 0xc1bf;
  if (*(int *)((long)in_RDI + 0x3bfbc) < (int)in_RDI[0x77f7]) {
    local_28 = (int)in_RDI[0x77f7];
  }
  else {
    local_28 = *(int *)((long)in_RDI + 0x3bfbc);
  }
  iVar2 = av1_init_search_range(local_28);
  *(int *)((long)in_RDI + 0x60dfc) = iVar2;
  if ((int)in_RDI[0xc13e] != 0) {
    iVar2 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0));
    if (iVar2 == 0) {
      if ((((int)in_RDI[0x782c] != 0) ||
          (bVar1 = false, *(char *)(*in_RDI + 400 + (ulong)*(byte *)(in_RDI + 0xe258)) == '\x06'))
         && (bVar1 = false, (int)*plVar3 != -1)) {
        bVar1 = 1 < (int)in_RDI[0xc13e];
      }
      if (bVar1) {
        if (SBORROW4(local_28,(int)*plVar3 * 2) == local_28 + (int)*plVar3 * -2 < 0) {
          local_30 = (int)*plVar3 << 1;
        }
        else {
          local_30 = local_28;
        }
        iVar2 = av1_init_search_range(local_30);
        *(int *)((long)in_RDI + 0x60dfc) = iVar2;
      }
      if ((*(byte *)(in_RDI + 0x13aba) & 1) != 0) {
        *(int *)plVar3 = -1;
      }
    }
    else {
      *(int *)plVar3 = local_28;
    }
  }
  return;
}

Assistant:

void av1_set_mv_search_params(AV1_COMP *cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  MotionVectorSearchParams *const mv_search_params = &cpi->mv_search_params;
  const int max_mv_def = AOMMAX(cm->width, cm->height);

  // Default based on max resolution.
  mv_search_params->mv_step_param = av1_init_search_range(max_mv_def);

  if (cpi->sf.mv_sf.auto_mv_step_size) {
    if (frame_is_intra_only(cm)) {
      // Initialize max_mv_magnitude for use in the first INTER frame
      // after a key/intra-only frame.
      mv_search_params->max_mv_magnitude = max_mv_def;
    } else {
      // Use adaptive mv steps based on previous frame stats for show frames and
      // internal arfs.
      FRAME_UPDATE_TYPE cur_update_type =
          cpi->ppi->gf_group.update_type[cpi->gf_frame_index];
      int use_auto_mv_step =
          (cm->show_frame || cur_update_type == INTNL_ARF_UPDATE) &&
          mv_search_params->max_mv_magnitude != -1 &&
          cpi->sf.mv_sf.auto_mv_step_size >= 2;
      if (use_auto_mv_step) {
        // Allow mv_steps to correspond to twice the max mv magnitude found
        // in the previous frame, capped by the default max_mv_magnitude based
        // on resolution.
        mv_search_params->mv_step_param = av1_init_search_range(
            AOMMIN(max_mv_def, 2 * mv_search_params->max_mv_magnitude));
      }
      // Reset max_mv_magnitude based on update flag.
      if (cpi->do_frame_data_update) mv_search_params->max_mv_magnitude = -1;
    }
  }
}